

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

bool __thiscall adios2::core::engine::BP4Reader::ProcessNextStepInMemory(BP4Reader *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  BP4Reader *in_RDI;
  bool saveReadStreaming;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar2 = in_RDI->m_MDFileProcessedSize < in_RDI->m_MDFileAlreadyReadSize;
  if (bVar2) {
    bVar1 = ((in_RDI->super_Engine).m_IO)->m_ReadStreaming;
    bVar3 = bVar1 & 1;
    ((in_RDI->super_Engine).m_IO)->m_ReadStreaming = false;
    ProcessMetadataForNewSteps(in_RDI,CONCAT17(bVar1,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff)
    ;
    ((in_RDI->super_Engine).m_IO)->m_ReadStreaming = (bool)(bVar3 & 1);
  }
  return bVar2;
}

Assistant:

bool BP4Reader::ProcessNextStepInMemory()
{
    if (m_MDFileAlreadyReadSize > m_MDFileProcessedSize)
    {
        // Hack: processing metadata for multiple new steps only works
        // when pretending not to be in streaming mode
        const bool saveReadStreaming = m_IO.m_ReadStreaming;
        m_IO.m_ReadStreaming = false;
        ProcessMetadataForNewSteps(0);
        m_IO.m_ReadStreaming = saveReadStreaming;
        return true;
    }
    return false;
}